

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

corpus_t *
corpus_load_headid(char *file,_func_int32_char_ptr *validate,
                  _func_int32_char_ptr_char_ptr *dup_resolve)

{
  int iVar1;
  int32 iVar2;
  uint uVar3;
  FILE *__stream;
  corpus_t *pcVar4;
  char *pcVar5;
  hash_table_t *phVar6;
  char **ppcVar7;
  size_t sVar8;
  void *pvVar9;
  corpus_t *corp;
  int32 n;
  int32 m;
  int32 k;
  int32 j;
  char *id;
  char wd [4096];
  char line [16384];
  FILE *fp;
  _func_int32_char_ptr_char_ptr *dup_resolve_local;
  _func_int32_char_ptr *validate_local;
  char *file_local;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
          ,0x9f,"Loading corpus (%s)\n",file);
  __stream = fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                   ,0xa2,"fopen(%s,r) failed\n",file);
    exit(1);
  }
  pcVar4 = (corpus_t *)
           __ckd_calloc__(1,0x18,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                          ,0xa4);
  corp._0_4_ = 0;
  while (pcVar5 = fgets(wd + 0xff8,0x4000,__stream), pcVar5 != (char *)0x0) {
    iVar1 = __isoc99_sscanf(wd + 0xff8,"%s",&id);
    if (iVar1 == 1) {
      corp._0_4_ = (uint)corp + 1;
    }
  }
  rewind(__stream);
  phVar6 = hash_table_new((uint)corp,0);
  pcVar4->ht = phVar6;
  pcVar4->n = 0;
  ppcVar7 = (char **)__ckd_calloc__((long)(int)(uint)corp,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                                    ,0xb0);
  pcVar4->str = ppcVar7;
  corp._0_4_ = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        do {
          pcVar5 = fgets(wd + 0xff8,0x4000,__stream);
          if (pcVar5 == (char *)0x0) {
            pcVar4->n = (uint)corp;
            fclose(__stream);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                    ,0xe5,"%s: %d entries\n",file,(ulong)(uint)corp);
            return pcVar4;
          }
          iVar1 = __isoc99_sscanf(wd + 0xff8,"%s%n",&id,&n);
        } while (iVar1 != 1);
        sVar8 = strlen(wd + 0xff8);
        m = (int32)sVar8;
        if ((0 < m) && (wd[(long)(m + -1) + 0xff8] == '\n')) {
          wd[(long)(m + -1) + 0xff8] = '\0';
        }
        if ((validate == (_func_int32_char_ptr *)0x0) ||
           (iVar2 = (*validate)(wd + (long)n + 0xff8), iVar2 != 0)) break;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                ,0xbf,"Corpus validation %s failed; skipping\n",&id);
      }
      _k = __ckd_salloc__((char *)&id,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                          ,0xc3);
      pvVar9 = hash_table_enter(pcVar4->ht,_k,(void *)(long)(int)(uint)corp);
      uVar3 = (uint)pvVar9;
      if (uVar3 != (uint)corp) break;
      pcVar5 = __ckd_salloc__(wd + (long)n + 0xff8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                              ,0xdd);
      pcVar4->str[(int)(uint)corp] = pcVar5;
      corp._0_4_ = (uint)corp + 1;
    }
    if (dup_resolve == (_func_int32_char_ptr_char_ptr *)0x0) break;
    m = (*dup_resolve)(pcVar4->str[(int)uVar3],wd + (long)n + 0xff8);
    if (m < 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
              ,0xcf,"corpus_load_headid(%s) failed; duplicate ID: %s\n",file,_k);
      exit(1);
    }
    ckd_free(_k);
    if (0 < m) {
      ckd_free(pcVar4->str[(int)uVar3]);
      pcVar5 = __ckd_salloc__(wd + (long)n + 0xff8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
                              ,0xd4);
      pcVar4->str[(int)uVar3] = pcVar5;
    }
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/corpus.c"
          ,0xc9,"corpus_load_headid(%s) failed; duplicate ID: %s\n",file,_k);
  exit(1);
}

Assistant:

corpus_t *
corpus_load_headid(const char *file,
                   int32(*validate) (char *str),
                   int32(*dup_resolve) (char *s1, char *s2))
{
    FILE *fp;
    char line[16384], wd[4096], *id;
    int32 j, k, m, n;
    corpus_t *corp;

    E_INFO("Loading corpus (%s)\n", file);

    if ((fp = fopen(file, "r")) == NULL)
        E_FATAL_SYSTEM("fopen(%s,r) failed\n", file);

    corp = (corpus_t *) ckd_calloc(1, sizeof(corpus_t));

    n = 0;
    while (fgets(line, sizeof(line), fp) != NULL) {
        /* Skip empty lines */
        if (sscanf(line, "%s", wd) == 1)
            n++;
    }
    rewind(fp);

    corp->ht = hash_table_new(n, HASH_CASE_YES);
    corp->n = 0;
    corp->str = (char **) ckd_calloc(n, sizeof(char *));

    n = 0;
    while (fgets(line, sizeof(line), fp) != NULL) {
        /* Skip blank lines */
        if (sscanf(line, "%s%n", wd, &k) != 1)
            continue;

        /* Eliminate the line-terminating newline */
        j = strlen(line);
        if ((j > 0) && (line[j - 1] == '\n'))
            line[j - 1] = '\0';

        /* Validate if a validation function is given */
        if (validate && (!(*validate) (line + k))) {
            E_INFO("Corpus validation %s failed; skipping\n", wd);
            continue;
        }

        id = ckd_salloc(wd);
        if ((m = (long) hash_table_enter(corp->ht, id, (void *)(long)n)) != n) {
            /* Duplicate entry */
            if (!dup_resolve)
                E_FATAL
                    ("corpus_load_headid(%s) failed; duplicate ID: %s\n",
                     file, id);
            else {
                /* Invoke the application provided duplicate resolver function */
                if ((j = (*dup_resolve) (corp->str[m], line + k)) < 0)
                    E_FATAL
                        ("corpus_load_headid(%s) failed; duplicate ID: %s\n",
                         file, id);
                ckd_free(id);
                if (j > 0) {
                    /* Overwrite the original with the new entry */
                    ckd_free(corp->str[m]);
                    corp->str[m] = ckd_salloc(line + k);
                }
                else {
                    /* Retain the original entry, discard the new one */
                }
            }
        }
        else {
            /* Fill in new entry */
            corp->str[n] = ckd_salloc(line + k);
            n++;
        }
    }
    corp->n = n;

    fclose(fp);

    E_INFO("%s: %d entries\n", file, n);

    return corp;
}